

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

int fits_in_region(double X,double Y,SAORegion *Rgn)

{
  int *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double in_XMM1_Qa;
  int comp_result;
  int result;
  int cur_comp;
  int i;
  RgnShape *Shapes;
  double th;
  double r;
  double yprime;
  double xprime;
  double dy;
  double dx;
  double y;
  double x;
  bool local_81;
  bool local_71;
  uint local_70;
  int local_68;
  int local_64;
  char *local_60;
  
  local_60 = *(char **)(in_RDI + 2);
  local_71 = false;
  local_70 = 0;
  local_68 = *(int *)(*(long *)(in_RDI + 2) + 8);
  for (local_64 = 0; local_64 < *in_RDI; local_64 = local_64 + 1) {
    if ((local_64 == 0) || (*(int *)(local_60 + 8) != local_68)) {
      local_71 = local_71 || local_70 != 0;
      local_68 = *(int *)(local_60 + 8);
      local_70 = (uint)((*local_60 != '\0' ^ 0xffU) & 1);
    }
    if (((local_70 == 0) && (*local_60 != '\0')) || ((local_70 != 0 && (*local_60 == '\0')))) {
      local_70 = 1;
      switch(*(undefined4 *)(local_60 + 4)) {
      case 0:
        if ((((in_XMM0_Qa - *(double *)(local_60 + 0x30) < -0.5) ||
             (0.5 <= in_XMM0_Qa - *(double *)(local_60 + 0x30))) ||
            (in_XMM1_Qa - *(double *)(local_60 + 0x38) < -0.5)) ||
           (0.5 <= in_XMM1_Qa - *(double *)(local_60 + 0x38))) {
          local_70 = 0;
        }
        break;
      case 1:
        dVar3 = (in_XMM0_Qa - *(double *)(local_60 + 0x30)) * *(double *)(local_60 + 0x90) +
                (in_XMM1_Qa - *(double *)(local_60 + 0x38)) * *(double *)(local_60 + 0x88);
        dVar4 = -(in_XMM0_Qa - *(double *)(local_60 + 0x30)) * *(double *)(local_60 + 0x88) +
                (in_XMM1_Qa - *(double *)(local_60 + 0x38)) * *(double *)(local_60 + 0x90);
        if (((dVar4 < -0.5) || (0.5 <= dVar4)) ||
           ((dVar3 < -0.5 || (*(double *)(local_60 + 0x98) <= dVar3)))) {
          local_70 = 0;
        }
        break;
      case 2:
        dVar3 = (in_XMM0_Qa - *(double *)(local_60 + 0x30)) *
                (in_XMM0_Qa - *(double *)(local_60 + 0x30)) +
                (in_XMM1_Qa - *(double *)(local_60 + 0x38)) *
                (in_XMM1_Qa - *(double *)(local_60 + 0x38));
        local_70 = (uint)(dVar3 < *(double *)(local_60 + 0x98) ||
                         dVar3 == *(double *)(local_60 + 0x98));
        break;
      case 3:
        dVar3 = (in_XMM0_Qa - *(double *)(local_60 + 0x30)) *
                (in_XMM0_Qa - *(double *)(local_60 + 0x30)) +
                (in_XMM1_Qa - *(double *)(local_60 + 0x38)) *
                (in_XMM1_Qa - *(double *)(local_60 + 0x38));
        if ((dVar3 < *(double *)(local_60 + 0x98)) ||
           (*(double *)(local_60 + 0xa0) <= dVar3 && dVar3 != *(double *)(local_60 + 0xa0))) {
          local_70 = 0;
        }
        break;
      case 4:
        dVar3 = ((in_XMM0_Qa - *(double *)(local_60 + 0x30)) * *(double *)(local_60 + 0x90) +
                (in_XMM1_Qa - *(double *)(local_60 + 0x38)) * *(double *)(local_60 + 0x88)) /
                *(double *)(local_60 + 0x40);
        dVar4 = (-(in_XMM0_Qa - *(double *)(local_60 + 0x30)) * *(double *)(local_60 + 0x88) +
                (in_XMM1_Qa - *(double *)(local_60 + 0x38)) * *(double *)(local_60 + 0x90)) /
                *(double *)(local_60 + 0x48);
        local_70 = (uint)(dVar3 * dVar3 + dVar4 * dVar4 <= 1.0);
        break;
      case 5:
        dVar3 = in_XMM0_Qa - *(double *)(local_60 + 0x30);
        dVar4 = in_XMM1_Qa - *(double *)(local_60 + 0x38);
        dVar2 = (dVar3 * *(double *)(local_60 + 0x90) + dVar4 * *(double *)(local_60 + 0x88)) /
                *(double *)(local_60 + 0x50);
        dVar1 = (-dVar3 * *(double *)(local_60 + 0x88) + dVar4 * *(double *)(local_60 + 0x90)) /
                *(double *)(local_60 + 0x58);
        if (dVar2 * dVar2 + dVar1 * dVar1 <= 1.0) {
          dVar2 = (dVar3 * *(double *)(local_60 + 0xa0) + dVar4 * *(double *)(local_60 + 0x98)) /
                  *(double *)(local_60 + 0x40);
          dVar3 = (-dVar3 * *(double *)(local_60 + 0x98) + dVar4 * *(double *)(local_60 + 0xa0)) /
                  *(double *)(local_60 + 0x48);
          local_70 = (uint)(1.0 <= dVar2 * dVar2 + dVar3 * dVar3);
        }
        else {
          local_70 = 0;
        }
        break;
      case 6:
        dVar3 = (in_XMM0_Qa - *(double *)(local_60 + 0x30)) * *(double *)(local_60 + 0x90) +
                (in_XMM1_Qa - *(double *)(local_60 + 0x38)) * *(double *)(local_60 + 0x88);
        dVar4 = -(in_XMM0_Qa - *(double *)(local_60 + 0x30)) * *(double *)(local_60 + 0x88) +
                (in_XMM1_Qa - *(double *)(local_60 + 0x38)) * *(double *)(local_60 + 0x90);
        if ((((dVar3 < -(*(double *)(local_60 + 0x40) * 0.5)) ||
             (*(double *)(local_60 + 0x40) * 0.5 < dVar3)) ||
            (dVar4 < -(*(double *)(local_60 + 0x48) * 0.5))) ||
           (*(double *)(local_60 + 0x48) * 0.5 < dVar4)) {
          local_70 = 0;
        }
        break;
      case 7:
        dVar3 = in_XMM0_Qa - *(double *)(local_60 + 0x30);
        dVar4 = in_XMM1_Qa - *(double *)(local_60 + 0x38);
        dVar2 = dVar3 * *(double *)(local_60 + 0x90) + dVar4 * *(double *)(local_60 + 0x88);
        dVar1 = -dVar3 * *(double *)(local_60 + 0x88) + dVar4 * *(double *)(local_60 + 0x90);
        if (((dVar2 < -(*(double *)(local_60 + 0x50) * 0.5)) ||
            (*(double *)(local_60 + 0x50) * 0.5 < dVar2)) ||
           ((dVar1 < -(*(double *)(local_60 + 0x58) * 0.5) ||
            (*(double *)(local_60 + 0x58) * 0.5 < dVar1)))) {
          local_70 = 0;
        }
        else {
          dVar2 = dVar3 * *(double *)(local_60 + 0xa0) + dVar4 * *(double *)(local_60 + 0x98);
          dVar3 = -dVar3 * *(double *)(local_60 + 0x98) + dVar4 * *(double *)(local_60 + 0xa0);
          if (((-(*(double *)(local_60 + 0x40) * 0.5) <= dVar2) &&
              (dVar2 <= *(double *)(local_60 + 0x40) * 0.5)) &&
             ((-(*(double *)(local_60 + 0x48) * 0.5) <= dVar3 &&
              (dVar3 <= *(double *)(local_60 + 0x48) * 0.5)))) {
            local_70 = 0;
          }
        }
        break;
      case 8:
        dVar3 = (in_XMM0_Qa - *(double *)(local_60 + 0x58)) * *(double *)(local_60 + 0x90) +
                (in_XMM1_Qa - *(double *)(local_60 + 0x60)) * *(double *)(local_60 + 0x88);
        dVar4 = -(in_XMM0_Qa - *(double *)(local_60 + 0x58)) * *(double *)(local_60 + 0x88) +
                (in_XMM1_Qa - *(double *)(local_60 + 0x60)) * *(double *)(local_60 + 0x90);
        if ((((dVar3 < -*(double *)(local_60 + 0x98)) || (*(double *)(local_60 + 0x98) < dVar3)) ||
            (dVar4 < -*(double *)(local_60 + 0xa0))) || (*(double *)(local_60 + 0xa0) < dVar4)) {
          local_70 = 0;
        }
        break;
      case 9:
        local_70 = (uint)(ABS(((in_XMM0_Qa - *(double *)(local_60 + 0x30)) *
                               *(double *)(local_60 + 0x90) +
                              (in_XMM1_Qa - *(double *)(local_60 + 0x38)) *
                              *(double *)(local_60 + 0x88)) / (*(double *)(local_60 + 0x40) * 0.5))
                          + ABS((-(in_XMM0_Qa - *(double *)(local_60 + 0x30)) *
                                 *(double *)(local_60 + 0x88) +
                                (in_XMM1_Qa - *(double *)(local_60 + 0x38)) *
                                *(double *)(local_60 + 0x90)) / (*(double *)(local_60 + 0x48) * 0.5)
                               ) <= 1.0);
        break;
      case 10:
        dVar3 = in_XMM0_Qa - *(double *)(local_60 + 0x30);
        dVar4 = in_XMM1_Qa - *(double *)(local_60 + 0x38);
        if (((dVar3 != 0.0) || (NAN(dVar3))) || ((dVar4 != 0.0 || (NAN(dVar4))))) {
          dVar3 = atan2(dVar4,dVar3);
          dVar3 = (dVar3 * 180.0) / 3.141592653589793;
          if (*(double *)(local_60 + 0x48) < *(double *)(local_60 + 0x40)) {
            if ((dVar3 < *(double *)(local_60 + 0x40)) &&
               (*(double *)(local_60 + 0x48) <= dVar3 && dVar3 != *(double *)(local_60 + 0x48))) {
              local_70 = 0;
            }
          }
          else if ((dVar3 < *(double *)(local_60 + 0x40)) ||
                  (*(double *)(local_60 + 0x48) <= dVar3 && dVar3 != *(double *)(local_60 + 0x48)))
          {
            local_70 = 0;
          }
        }
        break;
      case 0xb:
        if ((((in_XMM0_Qa < *(double *)(local_60 + 0x10)) ||
             (*(double *)(local_60 + 0x18) <= in_XMM0_Qa &&
              in_XMM0_Qa != *(double *)(local_60 + 0x18))) ||
            (in_XMM1_Qa < *(double *)(local_60 + 0x20))) ||
           (*(double *)(local_60 + 0x28) <= in_XMM1_Qa && in_XMM1_Qa != *(double *)(local_60 + 0x28)
           )) {
          local_70 = 0;
        }
        else {
          local_70 = Pt_in_Poly(in_XMM0_Qa,in_XMM1_Qa,*(int *)(local_60 + 0x30),
                                *(double **)(local_60 + 0x38));
        }
        break;
      case 0xc:
        dVar3 = in_XMM0_Qa - *(double *)(local_60 + 0x30);
        dVar4 = in_XMM1_Qa - *(double *)(local_60 + 0x38);
        dVar2 = dVar3 * dVar3 + dVar4 * dVar4;
        if ((dVar2 < *(double *)(local_60 + 0x98)) ||
           (*(double *)(local_60 + 0xa0) <= dVar2 && dVar2 != *(double *)(local_60 + 0xa0))) {
          local_70 = 0;
        }
        else if ((((dVar3 != 0.0) || (NAN(dVar3))) || (dVar4 != 0.0)) || (NAN(dVar4))) {
          dVar3 = atan2(dVar4,dVar3);
          dVar3 = (dVar3 * 180.0) / 3.141592653589793;
          if (*(double *)(local_60 + 0x48) < *(double *)(local_60 + 0x40)) {
            if ((dVar3 < *(double *)(local_60 + 0x40)) &&
               (*(double *)(local_60 + 0x48) <= dVar3 && dVar3 != *(double *)(local_60 + 0x48))) {
              local_70 = 0;
            }
          }
          else if ((dVar3 < *(double *)(local_60 + 0x40)) ||
                  (*(double *)(local_60 + 0x48) <= dVar3 && dVar3 != *(double *)(local_60 + 0x48)))
          {
            local_70 = 0;
          }
        }
        break;
      case 0xd:
        dVar3 = (in_XMM0_Qa - *(double *)(local_60 + 0x30)) * *(double *)(local_60 + 0x90) +
                (in_XMM1_Qa - *(double *)(local_60 + 0x38)) * *(double *)(local_60 + 0x88);
        dVar4 = -(in_XMM0_Qa - *(double *)(local_60 + 0x30)) * *(double *)(local_60 + 0x88) +
                (in_XMM1_Qa - *(double *)(local_60 + 0x38)) * *(double *)(local_60 + 0x90);
        if ((dVar3 / *(double *)(local_60 + 0x68)) * (dVar3 / *(double *)(local_60 + 0x68)) +
            (dVar4 / *(double *)(local_60 + 0x70)) * (dVar4 / *(double *)(local_60 + 0x70)) <= 1.0)
        {
          if (1.0 <= (dVar3 / *(double *)(local_60 + 0x58)) * (dVar3 / *(double *)(local_60 + 0x58))
                     + (dVar4 / *(double *)(local_60 + 0x60)) *
                       (dVar4 / *(double *)(local_60 + 0x60))) {
            if ((((dVar3 != 0.0) || (NAN(dVar3))) || (dVar4 != 0.0)) || (NAN(dVar4))) {
              dVar3 = atan2(dVar4,dVar3);
              dVar3 = (dVar3 * 180.0) / 3.141592653589793;
              if (*(double *)(local_60 + 0x48) < *(double *)(local_60 + 0x40)) {
                if ((dVar3 < *(double *)(local_60 + 0x40)) &&
                   (*(double *)(local_60 + 0x48) <= dVar3 && dVar3 != *(double *)(local_60 + 0x48)))
                {
                  local_70 = 0;
                }
              }
              else if ((dVar3 < *(double *)(local_60 + 0x40)) ||
                      (*(double *)(local_60 + 0x48) <= dVar3 &&
                       dVar3 != *(double *)(local_60 + 0x48))) {
                local_70 = 0;
              }
            }
          }
          else {
            local_70 = 0;
          }
        }
        else {
          local_70 = 0;
        }
        break;
      case 0xe:
        dVar3 = (in_XMM0_Qa - *(double *)(local_60 + 0x30)) * *(double *)(local_60 + 0x90) +
                (in_XMM1_Qa - *(double *)(local_60 + 0x38)) * *(double *)(local_60 + 0x88);
        dVar4 = -(in_XMM0_Qa - *(double *)(local_60 + 0x30)) * *(double *)(local_60 + 0x88) +
                (in_XMM1_Qa - *(double *)(local_60 + 0x38)) * *(double *)(local_60 + 0x90);
        if ((((dVar3 < -(*(double *)(local_60 + 0x68) * 0.5)) ||
             (*(double *)(local_60 + 0x68) * 0.5 < dVar3)) ||
            (dVar4 < -(*(double *)(local_60 + 0x70) * 0.5))) ||
           (*(double *)(local_60 + 0x70) * 0.5 < dVar4)) {
          local_70 = 0;
        }
        else if (((dVar3 < -(*(double *)(local_60 + 0x58) * 0.5)) ||
                 (*(double *)(local_60 + 0x58) * 0.5 < dVar3)) ||
                ((dVar4 < -(*(double *)(local_60 + 0x60) * 0.5) ||
                 (*(double *)(local_60 + 0x60) * 0.5 < dVar4)))) {
          if ((((dVar3 != 0.0) || (NAN(dVar3))) || (dVar4 != 0.0)) || (NAN(dVar4))) {
            dVar3 = atan2(dVar4,dVar3);
            dVar3 = (dVar3 * 180.0) / 3.141592653589793;
            if (*(double *)(local_60 + 0x48) < *(double *)(local_60 + 0x40)) {
              if ((dVar3 < *(double *)(local_60 + 0x40)) &&
                 (*(double *)(local_60 + 0x48) <= dVar3 && dVar3 != *(double *)(local_60 + 0x48))) {
                local_70 = 0;
              }
            }
            else if ((dVar3 < *(double *)(local_60 + 0x40)) ||
                    (*(double *)(local_60 + 0x48) <= dVar3 && dVar3 != *(double *)(local_60 + 0x48))
                    ) {
              local_70 = 0;
            }
          }
        }
        else {
          local_70 = 0;
        }
      }
      if (*local_60 == '\0') {
        local_70 = (uint)((local_70 != 0 ^ 0xffU) & 1);
      }
    }
    local_60 = local_60 + 0xa8;
  }
  local_81 = local_71 || local_70 != 0;
  return (uint)local_81;
}

Assistant:

int fits_in_region( double    X,
            double    Y,
            SAORegion *Rgn )
/*  Test if the given point is within the region described by Rgn.  X and    */
/*  Y are in pixel coordinates.                                              */
/*---------------------------------------------------------------------------*/
{
   double x, y, dx, dy, xprime, yprime, r, th;
   RgnShape *Shapes;
   int i, cur_comp;
   int result, comp_result;

   Shapes = Rgn->Shapes;

   result = 0;
   comp_result = 0;
   cur_comp = Rgn->Shapes[0].comp;

   for( i=0; i<Rgn->nShapes; i++, Shapes++ ) {

     /* if this region has a different component number to the last one  */
     /*	then replace the accumulated selection logical with the union of */
     /*	the current logical and the total logical. Reinitialize the      */
     /* temporary logical.                                               */

     if ( i==0 || Shapes->comp != cur_comp ) {
       result = result || comp_result;
       cur_comp = Shapes->comp;
       /* if an excluded region is given first, then implicitly   */
       /* assume a previous shape that includes the entire image. */
       comp_result = !Shapes->sign;
     }

    /* only need to test if  */
    /*   the point is not already included and this is an include region, */
    /* or the point is included and this is an excluded region */

    if ( (!comp_result && Shapes->sign) || (comp_result && !Shapes->sign) ) { 

      comp_result = 1;

      switch( Shapes->shape ) {

      case box_rgn:
         /*  Shift origin to center of region  */
         xprime = X - Shapes->param.gen.p[0];
         yprime = Y - Shapes->param.gen.p[1];

         /*  Rotate point to region's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;

         dx = 0.5 * Shapes->param.gen.p[2];
         dy = 0.5 * Shapes->param.gen.p[3];
         if( (x < -dx) || (x > dx) || (y < -dy) || (y > dy) )
            comp_result = 0;
         break;

      case boxannulus_rgn:
         /*  Shift origin to center of region  */
         xprime = X - Shapes->param.gen.p[0];
         yprime = Y - Shapes->param.gen.p[1];

         /*  Rotate point to region's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;

         dx = 0.5 * Shapes->param.gen.p[4];
         dy = 0.5 * Shapes->param.gen.p[5];
         if( (x < -dx) || (x > dx) || (y < -dy) || (y > dy) ) {
	   comp_result = 0;
	 } else {
	   /* Repeat test for inner box */
	   x =  xprime * Shapes->param.gen.b + yprime * Shapes->param.gen.a;
	   y = -xprime * Shapes->param.gen.a + yprime * Shapes->param.gen.b;
	   
	   dx = 0.5 * Shapes->param.gen.p[2];
	   dy = 0.5 * Shapes->param.gen.p[3];
	   if( (x >= -dx) && (x <= dx) && (y >= -dy) && (y <= dy) )
	     comp_result = 0;
	 }
         break;

      case rectangle_rgn:
         /*  Shift origin to center of region  */
         xprime = X - Shapes->param.gen.p[5];
         yprime = Y - Shapes->param.gen.p[6];

         /*  Rotate point to region's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;

         dx = Shapes->param.gen.a;
         dy = Shapes->param.gen.b;
         if( (x < -dx) || (x > dx) || (y < -dy) || (y > dy) )
            comp_result = 0;
         break;

      case diamond_rgn:
         /*  Shift origin to center of region  */
         xprime = X - Shapes->param.gen.p[0];
         yprime = Y - Shapes->param.gen.p[1];

         /*  Rotate point to region's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;

         dx = 0.5 * Shapes->param.gen.p[2];
         dy = 0.5 * Shapes->param.gen.p[3];
         r  = fabs(x/dx) + fabs(y/dy);
         if( r > 1 )
            comp_result = 0;
         break;

      case circle_rgn:
         /*  Shift origin to center of region  */
         x = X - Shapes->param.gen.p[0];
         y = Y - Shapes->param.gen.p[1];

         r  = x*x + y*y;
         if ( r > Shapes->param.gen.a )
            comp_result = 0;
         break;

      case annulus_rgn:
         /*  Shift origin to center of region  */
         x = X - Shapes->param.gen.p[0];
         y = Y - Shapes->param.gen.p[1];

         r = x*x + y*y;
         if ( r < Shapes->param.gen.a || r > Shapes->param.gen.b )
            comp_result = 0;
         break;

      case sector_rgn:
         /*  Shift origin to center of region  */
         x = X - Shapes->param.gen.p[0];
         y = Y - Shapes->param.gen.p[1];

         if( x || y ) {
            r = atan2( y, x ) * RadToDeg;
            if( Shapes->param.gen.p[2] <= Shapes->param.gen.p[3] ) {
               if( r < Shapes->param.gen.p[2] || r > Shapes->param.gen.p[3] )
                  comp_result = 0;
            } else {
               if( r < Shapes->param.gen.p[2] && r > Shapes->param.gen.p[3] )
                  comp_result = 0;
            }
         }
         break;

      case ellipse_rgn:
         /*  Shift origin to center of region  */
         xprime = X - Shapes->param.gen.p[0];
         yprime = Y - Shapes->param.gen.p[1];

         /*  Rotate point to region's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;

         x /= Shapes->param.gen.p[2];
         y /= Shapes->param.gen.p[3];
         r = x*x + y*y;
         if( r>1.0 )
            comp_result = 0;
         break;

      case elliptannulus_rgn:
         /*  Shift origin to center of region  */
         xprime = X - Shapes->param.gen.p[0];
         yprime = Y - Shapes->param.gen.p[1];

         /*  Rotate point to outer ellipse's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;

         x /= Shapes->param.gen.p[4];
         y /= Shapes->param.gen.p[5];
         r = x*x + y*y;
         if( r>1.0 )
            comp_result = 0;
         else {
            /*  Repeat test for inner ellipse  */
            x =  xprime * Shapes->param.gen.b + yprime * Shapes->param.gen.a;
            y = -xprime * Shapes->param.gen.a + yprime * Shapes->param.gen.b;

            x /= Shapes->param.gen.p[2];
            y /= Shapes->param.gen.p[3];
            r = x*x + y*y;
            if( r<1.0 )
               comp_result = 0;
         }
         break;

      case line_rgn:
         /*  Shift origin to first point of line  */
         xprime = X - Shapes->param.gen.p[0];
         yprime = Y - Shapes->param.gen.p[1];

         /*  Rotate point to line's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;

         if( (y < -0.5) || (y >= 0.5) || (x < -0.5)
             || (x >= Shapes->param.gen.a) )
            comp_result = 0;
         break;

      case point_rgn:
         /*  Shift origin to center of region  */
         x = X - Shapes->param.gen.p[0];
         y = Y - Shapes->param.gen.p[1];

         if ( (x<-0.5) || (x>=0.5) || (y<-0.5) || (y>=0.5) )
            comp_result = 0;
         break;

      case poly_rgn:
         if( X<Shapes->xmin || X>Shapes->xmax
             || Y<Shapes->ymin || Y>Shapes->ymax )
            comp_result = 0;
         else
            comp_result = Pt_in_Poly( X, Y, Shapes->param.poly.nPts,
                                       Shapes->param.poly.Pts );
         break;

      case panda_rgn:
         /*  Shift origin to center of region  */
         x = X - Shapes->param.gen.p[0];
         y = Y - Shapes->param.gen.p[1];

         r = x*x + y*y;
         if ( r < Shapes->param.gen.a || r > Shapes->param.gen.b ) {
	   comp_result = 0;
	 } else {
	   if( x || y ) {
	     th = atan2( y, x ) * RadToDeg;
	     if( Shapes->param.gen.p[2] <= Shapes->param.gen.p[3] ) {
               if( th < Shapes->param.gen.p[2] || th > Shapes->param.gen.p[3] )
		 comp_result = 0;
	     } else {
               if( th < Shapes->param.gen.p[2] && th > Shapes->param.gen.p[3] )
		 comp_result = 0;
	     }
	   }
         }
         break;

      case epanda_rgn:
         /*  Shift origin to center of region  */
         xprime = X - Shapes->param.gen.p[0];
         yprime = Y - Shapes->param.gen.p[1];

         /*  Rotate point to region's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;
	 xprime = x;
	 yprime = y;

	 /* outer region test */
         x = xprime/Shapes->param.gen.p[7];
         y = yprime/Shapes->param.gen.p[8];
         r = x*x + y*y;
	 if ( r>1.0 )
	   comp_result = 0;
	 else {
	   /* inner region test */
	   x = xprime/Shapes->param.gen.p[5];
	   y = yprime/Shapes->param.gen.p[6];
	   r = x*x + y*y;
	   if ( r<1.0 )
	     comp_result = 0;
	   else {
	     /* angle test */
	     if( xprime || yprime ) {
	       th = atan2( yprime, xprime ) * RadToDeg;
	       if( Shapes->param.gen.p[2] <= Shapes->param.gen.p[3] ) {
		 if( th < Shapes->param.gen.p[2] || th > Shapes->param.gen.p[3] )
		   comp_result = 0;
	       } else {
		 if( th < Shapes->param.gen.p[2] && th > Shapes->param.gen.p[3] )
		   comp_result = 0;
	       }
	     }
	   }
	 }
         break;

      case bpanda_rgn:
         /*  Shift origin to center of region  */
         xprime = X - Shapes->param.gen.p[0];
         yprime = Y - Shapes->param.gen.p[1];

         /*  Rotate point to region's orientation  */
         x =  xprime * Shapes->param.gen.cosT + yprime * Shapes->param.gen.sinT;
         y = -xprime * Shapes->param.gen.sinT + yprime * Shapes->param.gen.cosT;

	 /* outer box test */
         dx = 0.5 * Shapes->param.gen.p[7];
         dy = 0.5 * Shapes->param.gen.p[8];
         if( (x < -dx) || (x > dx) || (y < -dy) || (y > dy) )
	   comp_result = 0;
	 else {
	   /* inner box test */
	   dx = 0.5 * Shapes->param.gen.p[5];
	   dy = 0.5 * Shapes->param.gen.p[6];
	   if( (x >= -dx) && (x <= dx) && (y >= -dy) && (y <= dy) )
	     comp_result = 0;
	   else {
	     /* angle test */
	     if( x || y ) {
	       th = atan2( y, x ) * RadToDeg;
	       if( Shapes->param.gen.p[2] <= Shapes->param.gen.p[3] ) {
		 if( th < Shapes->param.gen.p[2] || th > Shapes->param.gen.p[3] )
		   comp_result = 0;
	       } else {
		 if( th < Shapes->param.gen.p[2] && th > Shapes->param.gen.p[3] )
		   comp_result = 0;
	       }
	     }
	   }
	 }
         break;
      }

      if( !Shapes->sign ) comp_result = !comp_result;

     } 

   }

   result = result || comp_result;
   
   return( result );
}